

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdSchnorrKeyPairTweakAdd
              (void *handle,char *privkey,char *tweak,char **tweaked_pubkey,bool *tweaked_parity,
              char **tweaked_privkey)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Privkey privkey_obj;
  char *work_pubkey;
  Privkey tweaked_privkey_obj;
  SchnorrPubkey schnorr_pubkey;
  ByteData256 tweak_obj;
  undefined1 local_d0 [32];
  char *local_b0;
  string local_a8;
  string local_88;
  undefined8 local_68;
  SchnorrPubkey local_60;
  ByteData256 local_48;
  
  local_b0 = (char *)0x0;
  local_68 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (bVar1) {
    local_d0._0_8_ = "cfdcapi_key.cpp";
    local_d0._8_4_ = 0x212;
    local_d0._16_8_ = "CfdSchnorrKeyPairTweakAdd";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"privkey is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. privkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(tweak);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_d0,tweak,(allocator *)&local_a8);
    cfd::core::ByteData256::ByteData256(&local_48,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_);
    }
    std::__cxx11::string::string((string *)&local_a8,privkey,(allocator *)&local_88);
    cfd::core::Privkey::Privkey((Privkey *)local_d0,&local_a8,kMainnet,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    cfd::core::Privkey::Privkey((Privkey *)&local_a8);
    cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
              (&local_60,(Privkey *)local_d0,&local_48,(Privkey *)&local_a8,tweaked_parity);
    if (tweaked_pubkey == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_88,&local_60);
      pcVar2 = cfd::capi::CreateString(&local_88);
      local_b0 = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if (tweaked_privkey == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,(Privkey *)&local_a8);
      pcVar3 = cfd::capi::CreateString(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if (tweaked_pubkey != (char **)0x0) {
      *tweaked_pubkey = pcVar2;
    }
    if (tweaked_privkey != (char **)0x0) {
      *tweaked_privkey = pcVar3;
    }
    if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((pointer)local_d0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._0_8_);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_d0._0_8_ = "cfdcapi_key.cpp";
  local_d0._8_4_ = 0x218;
  local_d0._16_8_ = "CfdSchnorrKeyPairTweakAdd";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"tweak is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"Failed to parameter. tweak is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSchnorrKeyPairTweakAdd(
    void* handle, const char* privkey, const char* tweak,
    char** tweaked_pubkey, bool* tweaked_parity, char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    Privkey privkey_obj = Privkey(std::string(privkey));
    Privkey tweaked_privkey_obj;
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey_obj, tweak_obj, &tweaked_privkey_obj, tweaked_parity);
    if (tweaked_pubkey != nullptr) {
      work_pubkey = CreateString(schnorr_pubkey.GetHex());
    }
    if (tweaked_privkey != nullptr) {
      work_privkey = CreateString(tweaked_privkey_obj.GetHex());
    }

    if (tweaked_pubkey != nullptr) *tweaked_pubkey = work_pubkey;
    if (tweaked_privkey != nullptr) *tweaked_privkey = work_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_privkey);
  return result;
}